

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epanet3.cpp
# Opt level: O0

int EN_runEpanet(char *inpFile,char *rptFile,char *outFile)

{
  ostream *poVar1;
  string local_1818 [32];
  string local_17f8 [32];
  int local_17d8;
  allocator local_17d1;
  string local_17d0 [32];
  string local_17b0 [32];
  stringstream local_1790 [8];
  stringstream ss;
  ostream local_1780 [376];
  double local_1608;
  double cpu_t;
  clock_t end_t;
  int local_15d4;
  int local_15d0;
  int tstep;
  int t;
  clock_t local_15c0;
  clock_t start_t;
  undefined1 local_15b0 [4];
  int err;
  Project p;
  char *outFile_local;
  char *rptFile_local;
  char *inpFile_local;
  
  p._5504_8_ = outFile;
  std::operator<<((ostream *)&std::cout,"\n... EPANET Version 3.0\n");
  Epanet::Project::Project((Project *)local_15b0);
  start_t._4_4_ = 0;
  local_15c0 = clock();
  start_t._4_4_ = Epanet::Project::openReport((Project *)local_15b0,rptFile);
  if (start_t._4_4_ == 0) {
    std::operator<<((ostream *)&std::cout,"\n    Reading input file ...");
    start_t._4_4_ = Epanet::Project::load((Project *)local_15b0,inpFile);
    if ((start_t._4_4_ == 0) &&
       (start_t._4_4_ = Epanet::Project::openOutput((Project *)local_15b0,(char *)p._5504_8_),
       start_t._4_4_ == 0)) {
      Epanet::Project::writeSummary((Project *)local_15b0);
      std::operator<<((ostream *)&std::cout,"\n    Initializing solver ...");
      start_t._4_4_ = Epanet::Project::initSolver((Project *)local_15b0,false);
      if (start_t._4_4_ == 0) {
        std::operator<<((ostream *)&std::cout,"\n    ");
        local_15d0 = 0;
        local_15d4 = 0;
        do {
          poVar1 = std::operator<<((ostream *)&std::cout,"\r    Solving network at ");
          Utilities::getTime_abi_cxx11_((Utilities *)&end_t,local_15d0 + local_15d4);
          poVar1 = std::operator<<(poVar1,(string *)&end_t);
          std::operator<<(poVar1," hrs ...        ");
          std::__cxx11::string::~string((string *)&end_t);
          start_t._4_4_ = Epanet::Project::runSolver((Project *)local_15b0,&local_15d0);
          Epanet::Project::writeMsgLog((Project *)local_15b0);
          if (start_t._4_4_ == 0) {
            start_t._4_4_ = Epanet::Project::advanceSolver((Project *)local_15b0,&local_15d4);
          }
        } while (0 < local_15d4 && start_t._4_4_ == 0);
      }
    }
  }
  if (start_t._4_4_ == 0) {
    cpu_t = (double)clock();
    local_1608 = (double)((long)cpu_t - local_15c0) / 1000000.0;
    std::__cxx11::stringstream::stringstream(local_1790);
    std::operator<<(local_1780,"\n  Simulation completed in ");
    std::__cxx11::stringstream::str();
    Epanet::Project::writeMsg((Project *)local_15b0,local_17b0);
    std::__cxx11::string::~string((string *)local_17b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17d0,"",&local_17d1);
    std::__cxx11::stringstream::str((string *)local_1790);
    std::__cxx11::string::~string(local_17d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
    if (0.001 <= local_1608) {
      local_17d8 = (int)std::setprecision(3);
      poVar1 = std::operator<<(local_1780,(_Setprecision)local_17d8);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1608);
      std::operator<<(poVar1," sec.");
    }
    else {
      std::operator<<(local_1780,"< 0.001 sec.");
    }
    std::__cxx11::stringstream::str();
    Epanet::Project::writeMsg((Project *)local_15b0,local_17f8);
    std::__cxx11::string::~string((string *)local_17f8);
    std::operator<<((ostream *)&std::cout,"\n    Writing report ...                           ");
    start_t._4_4_ = Epanet::Project::writeReport((Project *)local_15b0);
    std::operator<<((ostream *)&std::cout,"\n    Simulation completed.                         \n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\n... EPANET completed in ");
    std::__cxx11::stringstream::str();
    poVar1 = std::operator<<(poVar1,local_1818);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_1818);
    std::__cxx11::stringstream::~stringstream(local_1790);
  }
  if (start_t._4_4_ == 0) {
    inpFile_local._4_4_ = 0;
  }
  else {
    Epanet::Project::writeMsgLog((Project *)local_15b0);
    std::operator<<((ostream *)&std::cout,
                    "\n\n    There were errors. See report file for details.\n");
    inpFile_local._4_4_ = start_t._4_4_;
  }
  Epanet::Project::~Project((Project *)local_15b0);
  return inpFile_local._4_4_;
}

Assistant:

int EN_runEpanet(const char* inpFile, const char* rptFile, const char* outFile)
{
    std::cout << "\n... EPANET Version 3.0\n";

    // ... declare a Project variable and an error indicator
    Project p;
    int err = 0;

    // ... initialize execution time clock
    clock_t start_t = clock();

    for (;;)
    {
        // ... open the command line files and load network data
        if ( (err = p.openReport(rptFile)) ) break;
        std::cout << "\n    Reading input file ...";
        if ( (err = p.load(inpFile)) ) break;
        if ( (err = p.openOutput(outFile)) ) break;
        p.writeSummary();

        // ... initialize the solver
        std::cout << "\n    Initializing solver ...";
        if ( (err = p.initSolver(false)) ) break;
        std::cout << "\n    ";

        // ... step through each time period
        int t = 0;
        int tstep = 0;
        do
        {
            std::cout << "\r    Solving network at "                     //r
                << Utilities::getTime(t+tstep) << " hrs ...        ";

            // ... run solver to compute hydraulics
            err = p.runSolver(&t);
            p.writeMsgLog();

            // ... advance solver to next period in time while solving for water quality
            if ( !err ) err = p.advanceSolver(&tstep);
        } while (tstep > 0 && !err );
        break;
    }

    // ... simulation was successful
    if ( !err )
    {
        // ... report execution time
        clock_t end_t = clock();
        double cpu_t = ((double) (end_t - start_t)) / CLOCKS_PER_SEC;
        std::stringstream ss;
        ss << "\n  Simulation completed in ";
        p.writeMsg(ss.str());
        ss.str("");
        if ( cpu_t < 0.001 ) ss << "< 0.001 sec.";
        else ss << std::setprecision(3) << cpu_t << " sec.";
        p.writeMsg(ss.str());

        // ... report simulation results
        std::cout << "\n    Writing report ...                           ";
        err = p.writeReport();
        std::cout << "\n    Simulation completed.                         \n";
        std::cout << "\n... EPANET completed in " << ss.str() << "\n";
    }

    if ( err )
    {
        p.writeMsgLog();
        std::cout << "\n\n    There were errors. See report file for details.\n";
        return err;
    }
    return 0;
}